

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt_MakeGlyphBitmapSubpixel
               (nk_tt_fontinfo *info,uchar *output,int out_w,int out_h,int out_stride,float scale_x,
               float scale_y,float shift_x,float shift_y,int glyph,nk_allocator *alloc)

{
  undefined1 local_68 [8];
  nk_tt__bitmap gbm;
  nk_tt_vertex *pnStack_48;
  int num_verts;
  nk_tt_vertex *vertices;
  int iy0;
  int ix0;
  int glyph_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int out_stride_local;
  int out_h_local;
  int out_w_local;
  uchar *output_local;
  nk_tt_fontinfo *info_local;
  
  iy0 = glyph;
  ix0 = (int)shift_y;
  glyph_local = (int)shift_x;
  shift_y_local = scale_y;
  shift_x_local = scale_x;
  scale_y_local = (float)out_stride;
  scale_x_local = (float)out_h;
  out_stride_local = out_w;
  _out_h_local = output;
  output_local = (uchar *)info;
  gbm.pixels._4_4_ = nk_tt_GetGlyphShape(info,alloc,glyph,&stack0xffffffffffffffb8);
  nk_tt_GetGlyphBitmapBoxSubpixel
            ((nk_tt_fontinfo *)output_local,iy0,shift_x_local,shift_y_local,(float)glyph_local,
             (float)ix0,(int *)((long)&vertices + 4),(int *)&vertices,(int *)0x0,(int *)0x0);
  gbm._8_8_ = _out_h_local;
  local_68._0_4_ = out_stride_local;
  local_68._4_4_ = scale_x_local;
  gbm.w = (int)scale_y_local;
  if ((out_stride_local != 0) && (scale_x_local != 0.0)) {
    nk_tt_Rasterize((nk_tt__bitmap *)local_68,0.35,pnStack_48,gbm.pixels._4_4_,shift_x_local,
                    shift_y_local,(float)glyph_local,(float)ix0,vertices._4_4_,(int)vertices,1,alloc
                   );
  }
  (*alloc->free)(alloc->userdata,pnStack_48);
  return;
}

Assistant:

NK_INTERN void
nk_tt_MakeGlyphBitmapSubpixel(const struct nk_tt_fontinfo *info, unsigned char *output,
    int out_w, int out_h, int out_stride, float scale_x, float scale_y,
    float shift_x, float shift_y, int glyph, struct nk_allocator *alloc)
{
    int ix0,iy0;
    struct nk_tt_vertex *vertices;
    int num_verts = nk_tt_GetGlyphShape(info, alloc, glyph, &vertices);
    struct nk_tt__bitmap gbm;

    nk_tt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x,
        shift_y, &ix0,&iy0,0,0);
    gbm.pixels = output;
    gbm.w = out_w;
    gbm.h = out_h;
    gbm.stride = out_stride;

    if (gbm.w && gbm.h)
        nk_tt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y,
            shift_x, shift_y, ix0,iy0, 1, alloc);
    alloc->free(alloc->userdata, vertices);
}